

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O2

void send_recv_start(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  eval_a = 1;
  iVar1 = uv_is_readable(0x303c90);
  eval_b = (int64_t)iVar1;
  if (eval_b == 1) {
    eval_a = 1;
    iVar1 = uv_is_writable(0x303c90);
    eval_b = (int64_t)iVar1;
    if (eval_b == 1) {
      iVar1 = uv_is_closing(0x303c90);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        iVar1 = uv_read_start(0x303c90,alloc_cb,read_cb);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          return;
        }
        pcVar4 = "0";
        pcVar3 = "r";
        uVar2 = 0x16b;
      }
      else {
        pcVar4 = "0";
        pcVar3 = "uv_is_closing((uv_handle_t*)&ctx2.channel)";
        uVar2 = 0x168;
      }
    }
    else {
      pcVar4 = "uv_is_writable((uv_stream_t*)&ctx2.channel)";
      pcVar3 = "1";
      uVar2 = 0x167;
    }
  }
  else {
    pcVar4 = "uv_is_readable((uv_stream_t*)&ctx2.channel)";
    pcVar3 = "1";
    uVar2 = 0x166;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc-send-recv.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

static void send_recv_start(void) {
  int r;
  ASSERT_EQ(1, uv_is_readable((uv_stream_t*)&ctx2.channel));
  ASSERT_EQ(1, uv_is_writable((uv_stream_t*)&ctx2.channel));
  ASSERT_OK(uv_is_closing((uv_handle_t*)&ctx2.channel));

  r = uv_read_start((uv_stream_t*)&ctx2.channel, alloc_cb, read_cb);
  ASSERT_OK(r);
}